

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_op_t * MIR_new_str_op(MIR_op_t *__return_storage_ptr__,MIR_context_t ctx,MIR_str_t str)

{
  string sStack_28;
  
  __return_storage_ptr__->field_0x8 = 9;
  __return_storage_ptr__->data = (void *)0x0;
  get_ctx_string(&sStack_28,ctx,str);
  (__return_storage_ptr__->u).i = sStack_28.str.len;
  (__return_storage_ptr__->u).str.s = sStack_28.str.s;
  return __return_storage_ptr__;
}

Assistant:

MIR_op_t MIR_new_str_op (MIR_context_t ctx, MIR_str_t str) {
  MIR_op_t op;

  init_op (&op, MIR_OP_STR);
  op.u.str = get_ctx_string (ctx, str).str;
  return op;
}